

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpx_helper.c
# Opt level: O2

uint64_t helper_bndldx64_x86_64(CPUX86State *env,target_ulong base,target_ulong ptr)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uintptr_t unaff_retaddr;
  
  uVar1 = lookup_bte64(env,base,unaff_retaddr);
  uVar2 = cpu_ldq_data_ra_x86_64(env,uVar1,unaff_retaddr);
  uVar3 = cpu_ldq_data_ra_x86_64(env,uVar1 + 8,unaff_retaddr);
  uVar1 = cpu_ldq_data_ra_x86_64(env,uVar1 + 0x10,unaff_retaddr);
  if (uVar1 != ptr) {
    uVar2 = 0;
    uVar3 = 0;
  }
  (env->mmx_t0)._q_MMXReg[0] = uVar3;
  return uVar2;
}

Assistant:

uint64_t helper_bndldx64(CPUX86State *env, target_ulong base, target_ulong ptr)
{
    uintptr_t ra = GETPC();
    uint64_t bte, lb, ub, pt;

    bte = lookup_bte64(env, base, ra);
    lb = cpu_ldq_data_ra(env, bte, ra);
    ub = cpu_ldq_data_ra(env, bte + 8, ra);
    pt = cpu_ldq_data_ra(env, bte + 16, ra);

    if (pt != ptr) {
        lb = ub = 0;
    }
    env->mmx_t0.MMX_Q(0) = ub;
    return lb;
}